

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-obj.c
# Opt level: O2

void do_cmd_uninscribe(command *cmd)

{
  uint32_t *puVar1;
  byte *pbVar2;
  player_upkeep *ppVar3;
  _Bool _Var4;
  wchar_t wVar5;
  object *obj;
  object *local_18;
  
  _Var4 = player_get_resume_normal_shape(player,cmd);
  if (_Var4) {
    wVar5 = cmd_get_item((command_conflict *)cmd,"item",&local_18,"Uninscribe which item?",
                         "You have nothing you can uninscribe.",obj_has_inscrip,L'\x0f');
    if (wVar5 == L'\0') {
      local_18->note = 0;
      msg("Inscription removed.");
      ppVar3 = player->upkeep;
      puVar1 = &ppVar3->notice;
      *puVar1 = *puVar1 | 3;
      pbVar2 = (byte *)((long)&ppVar3->redraw + 2);
      *pbVar2 = *pbVar2 | 6;
    }
  }
  return;
}

Assistant:

void do_cmd_uninscribe(struct command *cmd)
{
	struct object *obj;

	if (!player_get_resume_normal_shape(player, cmd)) {
		return;
	}

	/* Get arguments */
	if (cmd_get_item(cmd, "item", &obj,
			/* Prompt */ "Uninscribe which item?",
			/* Error  */ "You have nothing you can uninscribe.",
			/* Filter */ obj_has_inscrip,
			/* Choice */ USE_EQUIP | USE_INVEN | USE_QUIVER | USE_FLOOR) != CMD_OK)
		return;

	obj->note = 0;
	msg("Inscription removed.");

	player->upkeep->notice |= (PN_COMBINE | PN_IGNORE);
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);
}